

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O3

Vector_Dense<double,_3UL> *
Disa::operator*(Vector_Dense<double,_3UL> *__return_storage_ptr__,Matrix_Sparse *matrix,
               Vector_Dense<double,_3UL> *vector)

{
  pointer puVar1;
  pointer puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  unsigned_long __val;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined **local_108;
  size_type local_100;
  undefined *local_f8;
  undefined8 uStack_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  if (matrix->column_size == 3) {
    puVar1 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((puVar1 != puVar2) && ((long)puVar1 - (long)puVar2 == 0x20)) {
      local_150 = std::
                  _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_sparse.hpp:1111:3)>
                  ::_M_invoke;
      local_158 = std::
                  _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_sparse.hpp:1111:3)>
                  ::_M_manager;
      local_168._M_unused._M_object = matrix;
      local_168._8_8_ = vector;
      Vector_Dense<double,_3UL>::Vector_Dense
                (__return_storage_ptr__,(function<double_(unsigned_long)> *)&local_168,3);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,3);
      }
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_108 = &PTR_s__workspace_llm4binary_github_lic_0018b268;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
               (Disa *)0x0,(Log_Level)&local_108,in_RCX);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_168._M_unused._0_8_,local_168._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"For static vectors the matrix must be square.",0x2d);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_28 = &PTR_s__workspace_llm4binary_github_lic_0018b250;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
               (Disa *)0x0,(Log_Level)&local_28,in_RCX);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_168._M_unused._0_8_,local_168._8_8_);
    puVar1 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    __val = 0;
    if (puVar1 != puVar2) {
      __val = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_a8,__val);
    std::operator+(&local_88,"Incompatible vector-matrix dimensions, ",&local_a8);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_88,",");
    local_148._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == paVar5) {
      local_148.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_148._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_c8,matrix->column_size);
    std::operator+(&local_68,&local_148,&local_c8);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_68," vs. ");
    local_128._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == paVar5) {
      local_128.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_128._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_e8,3);
    std::operator+(&local_48,&local_128,&local_e8);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_48,".");
    local_108 = (undefined **)(pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108 == paVar5) {
      local_f8 = (undefined *)paVar5->_M_allocated_capacity;
      uStack_f0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_108 = &local_f8;
    }
    else {
      local_f8 = (undefined *)paVar5->_M_allocated_capacity;
    }
    local_100 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_108,local_100);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)local_168._M_pod_data);
  exit(1);
}

Assistant:

Vector_Dense<Scalar, _size> operator*(const Matrix_Sparse& matrix, const Vector_Dense<Scalar, _size>& vector) {
  ASSERT_DEBUG(matrix.size_column() == vector.size(),
               "Incompatible vector-matrix dimensions, " + std::to_string(matrix.size_row()) + "," +
               std::to_string(matrix.size_column()) + " vs. " + std::to_string(vector.size()) + ".");
  ASSERT_DEBUG(!_size || matrix.size_row() == vector.size(), "For static vectors the matrix must be square.");
  return Vector_Dense<Scalar, _size>(
  [&](const std::size_t i_row, Scalar value = 0) {
    FOR_ITER(iter, *(matrix.begin() + i_row)) value += *iter * vector[iter.i_column()];
    return value;
  },
  matrix.size_row());
}